

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhUnlinkCell(lhcell *pCell)

{
  lhpage *pPage;
  sxu16 sVar1;
  int iVar2;
  lhcell *plVar3;
  uchar *puVar4;
  
  pPage = pCell->pPage;
  iVar2 = (*pPage->pHash->pIo->xWrite)(pPage->pRaw);
  if (iVar2 == 0) {
    plVar3 = lhFindSibeling(pCell);
    sVar1 = pCell->iNext;
    if (plVar3 == (lhcell *)0x0) {
      (pPage->sHdr).iOfft = sVar1;
      puVar4 = pPage->pRaw->zData;
    }
    else {
      plVar3->iNext = sVar1;
      puVar4 = pPage->pRaw->zData + (ulong)plVar3->iStart + 0x10;
    }
    puVar4[1] = (uchar)sVar1;
    *puVar4 = (uchar)(sVar1 >> 8);
    sVar1 = 0x1a;
    if (pCell->iOvfl == 0) {
      sVar1 = (short)pCell->nKey + (short)(int)pCell->nData + 0x1a;
    }
    lhRestoreSpace(pPage,pCell->iStart,sVar1);
    lhCellDiscard(pCell);
  }
  return iVar2;
}

Assistant:

static int lhUnlinkCell(lhcell *pCell)
{
	lhash_kv_engine *pEngine = pCell->pPage->pHash;
	lhpage *pPage = pCell->pPage;
	sxu16 nByte = L_HASH_CELL_SZ;
	lhcell *pPrev;
	int rc;
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Bring the link */
	pPrev = lhFindSibeling(pCell);
	if( pPrev ){
		pPrev->iNext = pCell->iNext;
		/* Fix offsets in the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[pPrev->iStart + 4/*Hash*/+4/*Key*/+8/*Data*/],pCell->iNext);
	}else{
		/* First entry on this page (either master or slave) */
		pPage->sHdr.iOfft = pCell->iNext;
		/* Update the page header */
		SyBigEndianPack16(pPage->pRaw->zData,pCell->iNext);
	}
	/* Restore cell space */
	if( pCell->iOvfl == 0 ){
		nByte += (sxu16)(pCell->nData + pCell->nKey);
	}
	lhRestoreSpace(pPage,pCell->iStart,nByte);
	/* Discard the cell from the in-memory hashtable */
	lhCellDiscard(pCell);
	return UNQLITE_OK;
}